

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Parser::ParseErase(Parser *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t val;
  PropertyName propName;
  
  bVar1 = CheckProperty(this,(size_t *)0x0);
  if (bVar1) {
    ParsePropertyName(&propName,this);
    if (propName.m_readOnly == true) {
      Error<>(this,"Can\'t erase a readonly property");
    }
    else {
      uVar2 = ParseSubscriptSet(this);
      Expect(this,NewLine,(char *)0x0);
      if (uVar2 == 0) {
        Error<>(this,"Expected index operator after erase keyword");
      }
      else {
        EmitOpcode(this,ErasePropKeyVal);
        BinaryWriter::Write(&this->m_writer,uVar2);
        BinaryWriter::Write(&this->m_writer,propName.m_id);
      }
    }
    PropertyName::~PropertyName(&propName);
  }
  else {
    bVar1 = CheckVariable(this);
    if (!bVar1) {
      Error<>(this,"Valid property or variable name expected after erase keyword");
      return;
    }
    ParseVariable_abi_cxx11_((String *)&propName,this);
    uVar2 = ParseSubscriptSet(this);
    Expect(this,NewLine,(char *)0x0);
    if (uVar2 == 0) {
      EmitOpcode(this,EraseItr);
      val = VariableNameToRuntimeID(this,(String *)&propName);
    }
    else {
      EmitOpcode(this,EraseVarKeyVal);
      BinaryWriter::Write(&this->m_writer,uVar2);
      val = VariableNameToRuntimeID(this,(String *)&propName);
    }
    BinaryWriter::Write(&this->m_writer,val);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&propName);
  }
  return;
}

Assistant:

inline_t void Parser::ParseErase()
	{
		if (CheckProperty())
		{
			auto propName = ParsePropertyName();
			if (propName.IsReadOnly())
			{
				Error("Can't erase a readonly property");
				return;
			}
			uint32_t subscripts = ParseSubscriptSet();
			Expect(SymbolType::NewLine);
			if (subscripts)
			{
				EmitOpcode(Opcode::ErasePropKeyVal);
				EmitCount(subscripts);
				EmitId(propName.GetId());
			}
			else
			{
				Error("Expected index operator after erase keyword");
				return;
			}
		}
		else if (CheckVariable())
		{
			auto varName = ParseVariable();
			uint32_t subscripts = ParseSubscriptSet();
			Expect(SymbolType::NewLine);
			if (subscripts)
			{
				EmitOpcode(Opcode::EraseVarKeyVal);
				EmitCount(subscripts);
				EmitId(VariableNameToRuntimeID(varName));
			}
			else
			{
				EmitOpcode(Opcode::EraseItr);
				EmitId(VariableNameToRuntimeID(varName));
			}
		}
		else
		{
			Error("Valid property or variable name expected after erase keyword");
			return;
		}
	}